

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa
          (BigUnsigned<84> *this,ParsedFloat *fp,int significant_digits)

{
  undefined4 in_EDX;
  undefined8 *in_RSI;
  undefined4 *in_RDI;
  int exponent_adjust;
  char *in_stack_00000020;
  char *in_stack_00000028;
  BigUnsigned<84> *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  SetToZero((BigUnsigned<84> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (*(int *)(in_RSI + 2) != 0) {
    __assert_fail("fp.type == FloatType::kNumber",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_bigint.cc"
                  ,0xae,
                  "int absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa(const ParsedFloat &, int) [max_words = 84]"
                 );
  }
  if (in_RSI[3] == 0) {
    in_RDI[1] = (int)*in_RSI;
    in_RDI[2] = (int)((ulong)*in_RSI >> 0x20);
    if (in_RDI[2] == 0) {
      if (in_RDI[1] != 0) {
        *in_RDI = 1;
      }
    }
    else {
      *in_RDI = 2;
    }
    local_4 = *(int *)(in_RSI + 1);
  }
  else {
    local_4 = ReadDigits(in_stack_00000030,in_stack_00000028,in_stack_00000020,this._4_4_);
    local_4 = *(int *)((long)in_RSI + 0xc) + local_4;
  }
  return local_4;
}

Assistant:

int BigUnsigned<max_words>::ReadFloatMantissa(const ParsedFloat& fp,
                                              int significant_digits) {
  SetToZero();
  assert(fp.type == FloatType::kNumber);

  if (fp.subrange_begin == nullptr) {
    // We already exactly parsed the mantissa, so no more work is necessary.
    words_[0] = fp.mantissa & 0xffffffffu;
    words_[1] = fp.mantissa >> 32;
    if (words_[1]) {
      size_ = 2;
    } else if (words_[0]) {
      size_ = 1;
    }
    return fp.exponent;
  }
  int exponent_adjust =
      ReadDigits(fp.subrange_begin, fp.subrange_end, significant_digits);
  return fp.literal_exponent + exponent_adjust;
}